

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void test_then_block(LexState *ls,int *escapelist)

{
  FuncState *fs;
  Dyndata *pDVar1;
  int line;
  int l2;
  TString *name;
  uint uVar2;
  uint uVar3;
  BlockCnt bl;
  expdesc v;
  BlockCnt local_58;
  expdesc local_40;
  
  fs = ls->fs;
  luaX_next(ls);
  subexpr(ls,&local_40,0);
  checknext(ls,0x112);
  if ((ls->t).token == 0x101) {
    line = ls->linenumber;
    luaK_goiffalse(ls->fs,&local_40);
    luaX_next(ls);
    local_58.insidetbc = false;
    local_58.isloop = '\0';
    local_58.nactvar = fs->nactvar;
    pDVar1 = fs->ls->dyd;
    local_58.firstlabel = (pDVar1->label).n;
    local_58.firstgoto = (pDVar1->gt).n;
    local_58.upval = '\0';
    local_58.previous = fs->bl;
    if (local_58.previous != (BlockCnt *)0x0) {
      local_58.insidetbc = (local_58.previous)->insidetbc != '\0';
    }
    fs->bl = &local_58;
    name = luaS_newlstr(ls->L,"break",5);
    newlabelentry(ls,&ls->dyd->gt,name,line,local_40.t);
    while ((ls->t).token == 0x3b) {
      luaX_next(ls);
    }
    uVar2 = (ls->t).token - 0x103;
    uVar3 = 0x1ffffff8 >> ((byte)uVar2 & 0x1f);
    if ((uVar3 & 1) == 0 && uVar2 < 0x1e) {
      leaveblock(fs);
    }
    else {
      line = luaK_jump(fs);
    }
    if ((uVar3 & 1) == 0 && uVar2 < 0x1e) {
      return;
    }
  }
  else {
    luaK_goiftrue(ls->fs,&local_40);
    local_58.insidetbc = false;
    local_58.isloop = '\0';
    local_58.nactvar = fs->nactvar;
    pDVar1 = fs->ls->dyd;
    local_58.firstlabel = (pDVar1->label).n;
    local_58.firstgoto = (pDVar1->gt).n;
    local_58.upval = '\0';
    local_58.previous = fs->bl;
    if (local_58.previous != (BlockCnt *)0x0) {
      local_58.insidetbc = (local_58.previous)->insidetbc != '\0';
    }
    fs->bl = &local_58;
    line = local_40.f;
  }
  statlist(ls);
  leaveblock(fs);
  if ((ls->t).token - 0x103U < 2) {
    l2 = luaK_jump(fs);
    luaK_concat(fs,escapelist,l2);
  }
  luaK_patchtohere(fs,line);
  return;
}

Assistant:

static void test_then_block (LexState *ls, int *escapelist) {
  /* test_then_block -> [IF | ELSEIF] cond THEN block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  expdesc v;
  int jf;  /* instruction to skip 'then' code (if condition is false) */
  luaX_next(ls);  /* skip IF or ELSEIF */
  expr(ls, &v);  /* read condition */
  checknext(ls, TK_THEN);
  if (ls->t.token == TK_BREAK) {  /* 'if x then break' ? */
    int line = ls->linenumber;
    luaK_goiffalse(ls->fs, &v);  /* will jump if condition is true */
    luaX_next(ls);  /* skip 'break' */
    enterblock(fs, &bl, 0);  /* must enter block before 'goto' */
    newgotoentry(ls, luaS_newliteral(ls->L, "break"), line, v.t);
    while (testnext(ls, ';')) {}  /* skip semicolons */
    if (block_follow(ls, 0)) {  /* jump is the entire block? */
      leaveblock(fs);
      return;  /* and that is it */
    }
    else  /* must skip over 'then' part if condition is false */
      jf = luaK_jump(fs);
  }
  else {  /* regular case (not a break) */
    luaK_goiftrue(ls->fs, &v);  /* skip over block if condition is false */
    enterblock(fs, &bl, 0);
    jf = v.f;
  }
  statlist(ls);  /* 'then' part */
  leaveblock(fs);
  if (ls->t.token == TK_ELSE ||
      ls->t.token == TK_ELSEIF)  /* followed by 'else'/'elseif'? */
    luaK_concat(fs, escapelist, luaK_jump(fs));  /* must jump over it */
  luaK_patchtohere(fs, jf);
}